

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::Render(void)

{
  int *piVar1;
  ImGuiViewportP *pIVar2;
  ImGuiWindow *window;
  ImVec2 IVar3;
  ImGuiContext *ctx;
  ImGuiContext *pIVar4;
  ImGuiWindow *pIVar5;
  ImDrawList *pIVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  ImDrawList **ppIVar10;
  ulong uVar11;
  int n;
  ulong uVar12;
  int n_2;
  long lVar13;
  ImGuiWindow *pIVar14;
  ImGuiWindow *windows_to_render_top_most [2];
  
  ctx = GImGui;
  iVar9 = GImGui->FrameCountEnded;
  if (iVar9 != GImGui->FrameCount) {
    EndFrame();
    iVar9 = ctx->FrameCount;
  }
  ctx->FrameCountRendered = iVar9;
  (ctx->IO).MetricsRenderWindows = 0;
  CallContextHooks(ctx,ImGuiContextHookType_RenderPre);
  for (uVar12 = 0; uVar12 != (uint)(ctx->Viewports).Size; uVar12 = uVar12 + 1) {
    pIVar2 = (ctx->Viewports).Data[uVar12];
    ImDrawDataBuilder::Clear(&pIVar2->DrawDataBuilder);
    if (pIVar2->DrawLists[0] != (ImDrawList *)0x0) {
      pIVar6 = GetBackgroundDrawList(&pIVar2->super_ImGuiViewport);
      AddDrawListToDrawData((pIVar2->DrawDataBuilder).Layers,pIVar6);
    }
  }
  pIVar14 = ctx->NavWindowingTarget;
  if (pIVar14 == (ImGuiWindow *)0x0) {
    windows_to_render_top_most[0] = (ImGuiWindow *)0x0;
    pIVar14 = (ImGuiWindow *)0x0;
  }
  else {
    if ((pIVar14->Flags & 0x2000) == 0) {
      windows_to_render_top_most[0] = pIVar14->RootWindow;
    }
    else {
      windows_to_render_top_most[0] = (ImGuiWindow *)0x0;
    }
    pIVar14 = ctx->NavWindowingListWindow;
  }
  pIVar5 = windows_to_render_top_most[0];
  windows_to_render_top_most[1] = pIVar14;
  for (uVar12 = 0; uVar12 != (uint)(ctx->Windows).Size; uVar12 = uVar12 + 1) {
    window = (ctx->Windows).Data[uVar12];
    if (((window->Active == true) && (window->Hidden == false)) &&
       ((window != pIVar14 && window != pIVar5) && (window->Flags & 0x1000000) == 0)) {
      AddRootWindowToDrawData(window);
    }
  }
  for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
    pIVar14 = windows_to_render_top_most[lVar13];
    if (((pIVar14 != (ImGuiWindow *)0x0) && (pIVar14->Active == true)) && (pIVar14->Hidden == false)
       ) {
      AddRootWindowToDrawData(pIVar14);
    }
  }
  (ctx->IO).MetricsRenderVertices = 0;
  (ctx->IO).MetricsRenderIndices = 0;
  for (lVar13 = 0; lVar13 < (ctx->Viewports).Size; lVar13 = lVar13 + 1) {
    pIVar2 = (ctx->Viewports).Data[lVar13];
    ImDrawDataBuilder::FlattenIntoSingleLayer(&pIVar2->DrawDataBuilder);
    if ((ctx->IO).MouseDrawCursor == true) {
      pIVar6 = GetForegroundDrawList(&pIVar2->super_ImGuiViewport);
      RenderMouseCursor(pIVar6,(ctx->IO).MousePos,(ctx->Style).MouseCursorScale,ctx->MouseCursor,
                        0xffffffff,0xff000000,0x30000000);
    }
    if (pIVar2->DrawLists[1] != (ImDrawList *)0x0) {
      pIVar6 = GetForegroundDrawList(&pIVar2->super_ImGuiViewport);
      AddDrawListToDrawData((pIVar2->DrawDataBuilder).Layers,pIVar6);
    }
    pIVar4 = GImGui;
    (pIVar2->DrawDataP).Valid = true;
    uVar7 = (pIVar2->DrawDataBuilder).Layers[0].Size;
    if ((int)uVar7 < 1) {
      ppIVar10 = (ImDrawList **)0x0;
    }
    else {
      ppIVar10 = (pIVar2->DrawDataBuilder).Layers[0].Data;
    }
    (pIVar2->DrawDataP).CmdLists = ppIVar10;
    (pIVar2->DrawDataP).CmdListsCount = uVar7;
    (pIVar2->DrawDataP).TotalIdxCount = 0;
    (pIVar2->DrawDataP).TotalVtxCount = 0;
    IVar3 = (pIVar2->super_ImGuiViewport).Size;
    (pIVar2->DrawDataP).DisplayPos = (pIVar2->super_ImGuiViewport).Pos;
    (pIVar2->DrawDataP).DisplaySize = IVar3;
    (pIVar2->DrawDataP).FramebufferScale = (pIVar4->IO).DisplayFramebufferScale;
    uVar8 = 0;
    uVar12 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar12 = uVar8;
    }
    iVar9 = 0;
    for (uVar11 = 0; uVar12 != uVar11; uVar11 = uVar11 + 1) {
      pIVar6 = (pIVar2->DrawDataBuilder).Layers[0].Data[uVar11];
      iVar9 = iVar9 + (pIVar6->VtxBuffer).Size;
      (pIVar2->DrawDataP).TotalVtxCount = iVar9;
      uVar7 = (int)uVar8 + (pIVar6->IdxBuffer).Size;
      uVar8 = (ulong)uVar7;
      (pIVar2->DrawDataP).TotalIdxCount = uVar7;
    }
    piVar1 = &(ctx->IO).MetricsRenderVertices;
    *piVar1 = *piVar1 + iVar9;
    piVar1 = &(ctx->IO).MetricsRenderIndices;
    *piVar1 = *piVar1 + (int)uVar8;
  }
  CallContextHooks(ctx,ImGuiContextHookType_RenderPost);
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    g.FrameCountRendered = g.FrameCount;
    g.IO.MetricsRenderWindows = 0;

    CallContextHooks(&g, ImGuiContextHookType_RenderPre);

    // Add background ImDrawList (for each active viewport)
    for (int n = 0; n != g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.Clear();
        if (viewport->DrawLists[0] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetBackgroundDrawList(viewport));
    }

    // Add ImDrawList to render
    ImGuiWindow* windows_to_render_top_most[2];
    windows_to_render_top_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindow : NULL;
    windows_to_render_top_most[1] = (g.NavWindowingTarget ? g.NavWindowingListWindow : NULL);
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_top_most[0] && window != windows_to_render_top_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_top_most); n++)
        if (windows_to_render_top_most[n] && IsWindowActiveAndVisible(windows_to_render_top_most[n])) // NavWindowingTarget is always temporarily displayed as the top-most window
            AddRootWindowToDrawData(windows_to_render_top_most[n]);

    // Setup ImDrawData structures for end-user
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = 0;
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.FlattenIntoSingleLayer();

        // Draw software mouse cursor if requested by io.MouseDrawCursor flag
        if (g.IO.MouseDrawCursor)
            RenderMouseCursor(GetForegroundDrawList(viewport), g.IO.MousePos, g.Style.MouseCursorScale, g.MouseCursor, IM_COL32_WHITE, IM_COL32_BLACK, IM_COL32(0, 0, 0, 48));

        // Add foreground ImDrawList (for each active viewport)
        if (viewport->DrawLists[1] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetForegroundDrawList(viewport));

        SetupViewportDrawData(viewport, &viewport->DrawDataBuilder.Layers[0]);
        ImDrawData* draw_data = &viewport->DrawDataP;
        g.IO.MetricsRenderVertices += draw_data->TotalVtxCount;
        g.IO.MetricsRenderIndices += draw_data->TotalIdxCount;
    }

    CallContextHooks(&g, ImGuiContextHookType_RenderPost);
}